

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOutput.cpp
# Opt level: O2

error<idx2::err_code> idx2::ReadFile(cstr FileName,buffer *Buf)

{
  long lVar1;
  int iVar2;
  anon_union_8_2_2df48d06_for_stref_0 aVar3;
  size_t sVar4;
  uint uVar5;
  undefined8 uVar6;
  char *pcVar7;
  long *in_FS_OFFSET;
  stref sVar8;
  error<idx2::err_code> eVar9;
  undefined4 uVar10;
  FILE *Fp;
  buffer *Buf_local;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_InputOutput_cpp:33:3)>
  __ScopeGuard__1;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_InputOutput_cpp:17:3)>
  __ScopeGuard__17;
  
  Buf_local = Buf;
  Fp = (FILE *)fopen(FileName,"rb");
  __ScopeGuard__17.Func.Fp = &Fp;
  __ScopeGuard__17.Dismissed = false;
  if ((FILE *)Fp == (FILE *)0x0) {
    *(char **)(*in_FS_OFFSET + -0x780) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x880) = 0x13;
    sVar8 = ToString(FileOpenFailed);
    lVar1 = *in_FS_OFFSET;
    iVar2 = snprintf((char *)(lVar1 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                     (ulong)(uint)sVar8.Size,sVar8.field_0.Ptr,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
                     ,0x13);
    pcVar7 = "%s";
    snprintf((char *)(lVar1 + -0xc80) + iVar2,0x400 - (long)iVar2,"%s",FileName);
    uVar6 = 0x1000000000d;
    goto LAB_00168302;
  }
  iVar2 = fseeko((FILE *)Fp,0,2);
  if (iVar2 == 0) {
    sVar4 = ftello((FILE *)Fp);
    if (sVar4 == 0xffffffffffffffff) {
      *(char **)(*in_FS_OFFSET + -0x780) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x880) = 0x1a;
      sVar8 = ToString(FileTellFailed);
      lVar1 = *in_FS_OFFSET;
      iVar2 = snprintf((char *)(lVar1 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                       (ulong)(uint)sVar8.Size,sVar8.field_0.Ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
                       ,0x1a);
      pcVar7 = "%s";
      snprintf((char *)(lVar1 + -0xc80) + iVar2,0x400 - (long)iVar2,"%s",FileName);
      uVar6 = 0x10000000010;
      goto LAB_00168302;
    }
    iVar2 = fseeko((FILE *)Fp,0,0);
    if (iVar2 == 0) {
      if (Buf->Bytes < (long)sVar4) {
        if (Mallocator()::Instance == '\0') {
          iVar2 = __cxa_guard_acquire(&Mallocator()::Instance);
          if (iVar2 != 0) {
            __cxa_guard_release(&Mallocator()::Instance);
          }
        }
        AllocBuf(Buf,sVar4,(allocator *)&Mallocator()::Instance);
        Buf = Buf_local;
      }
      __ScopeGuard__1.Func.Buf = &Buf_local;
      __ScopeGuard__1.Dismissed = false;
      sVar4 = fread(Buf->Data,sVar4,1,(FILE *)Fp);
      if (sVar4 == 1) {
        __ScopeGuard__1.Dismissed = true;
        *(char **)(*in_FS_OFFSET + -0x780) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x880) = 0x26;
        pcVar7 = "";
        uVar6 = 0;
      }
      else {
        *(char **)(*in_FS_OFFSET + -0x780) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x880) = 0x23;
        sVar8 = ToString(FileReadFailed);
        lVar1 = *in_FS_OFFSET;
        iVar2 = snprintf((char *)(lVar1 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                         (ulong)(uint)sVar8.Size,sVar8.field_0.Ptr,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
                         ,0x23);
        pcVar7 = "%s";
        snprintf((char *)(lVar1 + -0xc80) + iVar2,0x400 - (long)iVar2,"%s",FileName);
        uVar6 = 0x1000000000b;
      }
      scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp:33:3)>
      ::~scope_guard(&__ScopeGuard__1);
      goto LAB_00168302;
    }
    *(char **)(*in_FS_OFFSET + -0x780) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x880) = 0x1c;
    sVar8 = ToString(FileSeekFailed);
    aVar3 = sVar8.field_0;
    uVar5 = sVar8.Size;
    lVar1 = *in_FS_OFFSET;
    uVar10 = 0x1c;
  }
  else {
    *(char **)(*in_FS_OFFSET + -0x780) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x880) = 0x17;
    sVar8 = ToString(FileSeekFailed);
    aVar3 = sVar8.field_0;
    uVar5 = sVar8.Size;
    lVar1 = *in_FS_OFFSET;
    uVar10 = 0x17;
  }
  iVar2 = snprintf((char *)(lVar1 + -0xc80),0x400,"%.*s (file %s, line %d): ",(ulong)uVar5,aVar3.Ptr
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
                   ,uVar10);
  pcVar7 = "%s";
  snprintf((char *)(lVar1 + -0xc80) + iVar2,0x400 - (long)iVar2,"%s",FileName);
  uVar6 = 0x1000000000f;
LAB_00168302:
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp:17:3)>
  ::~scope_guard(&__ScopeGuard__17);
  eVar9.Code = (int)uVar6;
  eVar9.StackIdx = (char)((ulong)uVar6 >> 0x20);
  eVar9.StrGened = (bool)(char)((ulong)uVar6 >> 0x28);
  eVar9._14_2_ = (short)((ulong)uVar6 >> 0x30);
  eVar9.Msg = pcVar7;
  return eVar9;
}

Assistant:

error<>
ReadFile(cstr FileName, buffer* Buf)
{
  idx2_Assert((Buf->Data && Buf->Bytes) || (!Buf->Data && !Buf->Bytes));

  FILE* Fp = fopen(FileName, "rb");
  idx2_CleanUp(if (Fp) fclose(Fp));
  if (!Fp)
    return idx2_Error(err_code::FileOpenFailed, "%s", FileName);

  /* Determine the file size */
  if (idx2_FSeek(Fp, 0, SEEK_END))
    return idx2_Error(err_code::FileSeekFailed, "%s", FileName);
  i64 Size = 0;
  if ((Size = idx2_FTell(Fp)) == -1)
    return idx2_Error(err_code::FileTellFailed, "%s", FileName);
  if (idx2_FSeek(Fp, 0, SEEK_SET))
    return idx2_Error(err_code::FileSeekFailed, "%s", FileName);
  if (Buf->Bytes < Size)
    AllocBuf(Buf, Size);

  /* Read file contents */
  idx2_CleanUp(1, DeallocBuf(Buf));
  if (fread(Buf->Data, size_t(Size), 1, Fp) != 1)
    return idx2_Error(err_code::FileReadFailed, "%s", FileName);

  idx2_DismissCleanUp(1);
  return idx2_Error(err_code::NoError);
}